

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O0

void test_refined_peaks_out_hw(void)

{
  runtime_error *prVar1;
  float local_9c;
  float local_90;
  float local_7c;
  float local_78;
  float refined_peaks [2];
  float tolerance;
  float j_true;
  float i_true;
  float cmap [16];
  int peaks [2];
  int counts;
  int window_size;
  int M;
  int W;
  int H;
  
  peaks[1] = 3;
  peaks[0] = 1;
  stack0xffffffffffffffdc = 0x200000001;
  memset(&j_true,0,0x40);
  cmap[0] = 1.0;
  cmap[3] = 2.0;
  cmap[4] = 3.0;
  cmap[5] = 1.0;
  cmap[8] = 2.0;
  refined_peaks[1] = 0.5972222;
  refined_peaks[0] = 1e-05;
  trt_pose::parse::refine_peaks_out_hw(&local_7c,peaks,(int *)(cmap + 0xf),&j_true,4,4,1,3);
  if (local_7c - 0.4027778 <= 0.0) {
    local_7c = -local_7c;
  }
  local_90 = local_7c - 0.4027778;
  if (1e-05 < local_90) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"i coordinate incorrect");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_78 - 0.5972222 <= 0.0) {
    local_78 = -local_78;
  }
  local_9c = local_78 - 0.5972222;
  if (local_9c <= 1e-05) {
    return;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar1,"j coordinate incorrect");
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_refined_peaks_out_hw()
{
  const int H = 4;
  const int W = 4;
  const int M = 1;
  const int window_size = 3;

  const int counts = 1;
  const int peaks[M * 2] = { 1, 2 };
  const float cmap[H * W] = {

    0., 0., 1., 0.,
    0., 2., 3., 1.,
    0., 0., 2., 0.,
    0., 0., 0., 0.

  };
  const float i_true = (0.5 + (1. * 0 + 2. * 1 + 3. * 1 + 1. * 1 + 2. * 2) / 9.) / H;
  const float j_true = (0.5 + (2. * 1 + 1. * 2 + 3. * 2 + 2. * 2 + 1. * 3) / 9.) / W;
  const float tolerance = 1e-5;

  float refined_peaks[M * 2];

  refine_peaks_out_hw(refined_peaks, &counts, peaks, cmap, H, W, M, window_size);

  if (ABS(refined_peaks[0] - i_true) > tolerance) {
    throw std::runtime_error("i coordinate incorrect");
  }
  if (ABS(refined_peaks[1] - j_true) > tolerance) {
    throw std::runtime_error("j coordinate incorrect");
  }
}